

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::finish(DefaultThreadPoolProvider *this)

{
  mutex *__mutex;
  
  __mutex = &((this->_data).
              super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_threadMutex;
  std::mutex::lock(__mutex);
  lockedFinish(this);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::finish ()
{
    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    lockedFinish ();
}